

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O0

mbedtls_mpi_uint mpi_sint_abs(mbedtls_mpi_sint z)

{
  mbedtls_mpi_sint z_local;
  undefined8 local_8;
  
  local_8 = z;
  if (z < 0) {
    local_8 = -z;
  }
  return local_8;
}

Assistant:

inline mbedtls_mpi_uint mpi_sint_abs(mbedtls_mpi_sint z)
{
    if (z >= 0) {
        return z;
    }
    /* Take care to handle the most negative value (-2^(biL-1)) correctly.
     * A naive -z would have undefined behavior.
     * Write this in a way that makes popular compilers happy (GCC, Clang,
     * MSVC). */
    return (mbedtls_mpi_uint) 0 - (mbedtls_mpi_uint) z;
}